

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void SerializeMany<DataStream,int,bool,std::__cxx11::string,char[16],ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
               (DataStream *s,int *args,bool *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               char (*args_3) [16],
               ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_>
               *args_4)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ser_writedata32<DataStream>(s,*args);
  Serialize<DataStream>(s,*args_1);
  Serialize<DataStream,char>(s,args_2);
  Serialize<DataStream,_char,_16>(s,args_3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_>::
    Serialize<DataStream>(args_4,s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}